

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printUserSettings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  double dVar1;
  ostream *poVar2;
  bool bVar3;
  SPxOut *pSVar4;
  SPxOut *pSVar5;
  string *psVar6;
  char *t;
  int i;
  long lVar7;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  lVar7 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar7 + -0x18) + 8) = 8;
  lVar7 = *(long *)(lVar7 + -0x18);
  pSVar5 = &this->spxout;
  *(uint *)(poVar2 + lVar7 + 0x18) = *(uint *)(poVar2 + lVar7 + 0x18) & 0xfffffefb | 4;
  psVar6 = (string *)
           &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::Settings::boolParam;
  bVar3 = false;
  for (lVar7 = 0; lVar7 != 0x1a; lVar7 = lVar7 + 1) {
    if (this->_currentSettings->_boolParamValues[lVar7] != (bool)(&DAT_0054e6e8)[lVar7]) {
      pSVar4 = soplex::operator<<(pSVar5,"bool:");
      std::__cxx11::string::string((string *)&local_50,psVar6);
      pSVar4 = soplex::operator<<(pSVar4,&local_50);
      pSVar4 = soplex::operator<<(pSVar4," = ");
      t = "false\n";
      if (this->_currentSettings->_boolParamValues[lVar7] != false) {
        t = "true\n";
      }
      soplex::operator<<(pSVar4,t);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = true;
    }
    psVar6 = psVar6 + 0x20;
  }
  psVar6 = (string *)
           &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::Settings::intParam;
  for (lVar7 = 0; lVar7 != 0x1c; lVar7 = lVar7 + 1) {
    if (this->_currentSettings->_intParamValues[lVar7] != (&DAT_0054ee10)[lVar7]) {
      pSVar4 = soplex::operator<<(pSVar5,"int:");
      std::__cxx11::string::string((string *)&local_70,psVar6);
      pSVar4 = soplex::operator<<(pSVar4,&local_70);
      pSVar4 = soplex::operator<<(pSVar4," = ");
      pSVar4 = soplex::operator<<(pSVar4,this->_currentSettings->_intParamValues[lVar7]);
      soplex::operator<<(pSVar4,"\n");
      std::__cxx11::string::~string((string *)&local_70);
      bVar3 = true;
    }
    psVar6 = psVar6 + 0x20;
  }
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  lVar7 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar7 + -0x18) + 8) = 8;
  lVar7 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar2 + lVar7 + 0x18) = *(uint *)(poVar2 + lVar7 + 0x18) & 0xfffffefb | 0x100;
  psVar6 = (string *)
           &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::Settings::realParam;
  for (lVar7 = 0; lVar7 != 0x1b; lVar7 = lVar7 + 1) {
    dVar1 = this->_currentSettings->_realParamValues[lVar7];
    if ((dVar1 != (double)(&DAT_0054f628)[lVar7]) ||
       (NAN(dVar1) || NAN((double)(&DAT_0054f628)[lVar7]))) {
      pSVar4 = soplex::operator<<(pSVar5,"real:");
      std::__cxx11::string::string((string *)&local_90,psVar6);
      pSVar4 = soplex::operator<<(pSVar4,&local_90);
      pSVar4 = soplex::operator<<(pSVar4," = ");
      pSVar4 = soplex::operator<<(pSVar4,this->_currentSettings->_realParamValues[lVar7]);
      soplex::operator<<(pSVar4,"\n");
      std::__cxx11::string::~string((string *)&local_90);
      bVar3 = true;
    }
    psVar6 = psVar6 + 0x20;
  }
  if ((this->_solver).random.seedshift == 0) {
    if (!bVar3) {
      return;
    }
  }
  else {
    pSVar5 = soplex::operator<<(pSVar5,"uint:random_seed = ");
    pSVar5 = soplex::operator<<(pSVar5,(this->_solver).random.seedshift);
    soplex::operator<<(pSVar5,"\n");
  }
  std::endl<char,std::char_traits<char>>((this->spxout).m_streams[(this->spxout).m_verbosity]);
  return;
}

Assistant:

void SoPlexBase<R>::printUserSettings()
{
   bool printedValue = false;

   SPxOut::setFixed(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(_currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      spxout << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
             (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
      printedValue = true;
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(_currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      spxout << "int:" << _currentSettings->intParam.name[i] << " = " <<
             _currentSettings->_intParamValues[i] << "\n";
      printedValue = true;
   }

   SPxOut::setScientific(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(_currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      spxout << "real:" << _currentSettings->realParam.name[i] << " = " <<
             _currentSettings->_realParamValues[i] << "\n";
      printedValue = true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(_currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      spxout << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
             _currentSettings->_rationalParamValues[i] << "\n";
      printedValue = true;
   }

#endif

   if(_solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      spxout << "uint:random_seed = " << _solver.random.getSeed() << "\n";
      printedValue = true;
   }

   if(printedValue)
      spxout << std::endl;
}